

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined1 *ptr;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  PHYSFS_Io *pPVar6;
  DirHandle *__s;
  undefined1 **ppuVar7;
  undefined1 *local_68;
  size_t local_60;
  long local_58;
  PHYSFS_Archiver *f;
  char *arcfname;
  PHYSFS_Io *io;
  char *fname;
  size_t len;
  DirHandle *h;
  FileHandle *fh;
  char *pcStack_18;
  int appending_local;
  char *_fname_local;
  
  ppuVar7 = &local_68;
  h = (DirHandle *)0x0;
  fh._4_4_ = appending;
  pcStack_18 = _fname;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local = (char *)0x0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    len = (size_t)writeDir;
    if (writeDir == (DirHandle *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
      __PHYSFS_platformReleaseMutex(stateLock);
      _fname_local = (char *)0x0;
    }
    else {
      local_60 = strlen(pcStack_18);
      sVar4 = dirHandleRootLen((DirHandle *)len);
      pcVar5 = (char *)(local_60 + sVar4 + 1);
      if (pcVar5 < (char *)0x100) {
        ppuVar7 = (undefined1 **)((long)&local_68 - (local_60 + sVar4 + 0x18 & 0xfffffffffffffff0));
        local_68 = (undefined1 *)ppuVar7;
      }
      else {
        local_68 = (undefined1 *)0x0;
      }
      ptr = local_68;
      fname = pcVar5;
      *(undefined8 *)((long)ppuVar7 + -8) = 0x10ae8c;
      pPVar6 = (PHYSFS_Io *)__PHYSFS_initSmallAlloc(ptr,(size_t)pcVar5);
      pcVar5 = pcStack_18;
      sVar4 = len;
      io = pPVar6;
      if (pPVar6 == (PHYSFS_Io *)0x0) {
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10aea1;
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10aead;
        __PHYSFS_platformReleaseMutex(stateLock);
        _fname_local = (char *)0x0;
      }
      else {
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10aecd;
        iVar3 = sanitizePlatformIndependentPathWithRoot((DirHandle *)sVar4,pcVar5,(char *)pPVar6);
        sVar4 = len;
        if (iVar3 != 0) {
          arcfname = (char *)0x0;
          f = (PHYSFS_Archiver *)io;
          *(undefined8 *)((long)ppuVar7 + -8) = 0x10aef5;
          iVar3 = verifyPath((DirHandle *)sVar4,(char **)&f,0);
          if (iVar3 != 0) {
            local_58 = *(long *)(len + 0x28);
            if (fh._4_4_ == 0) {
              pcVar1 = *(code **)(local_58 + 0x48);
              uVar2 = *(undefined8 *)len;
              *(undefined8 *)((long)ppuVar7 + -8) = 0x10af40;
              arcfname = (char *)(*pcVar1)(uVar2);
            }
            else {
              pcVar1 = *(code **)(local_58 + 0x50);
              uVar2 = *(undefined8 *)len;
              *(undefined8 *)((long)ppuVar7 + -8) = 0x10af25;
              arcfname = (char *)(*pcVar1)(uVar2);
            }
            if (arcfname != (char *)0x0) {
              *(undefined8 *)((long)ppuVar7 + -8) = 0x10af56;
              __s = (DirHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
              pcVar5 = arcfname;
              h = __s;
              if (__s == (DirHandle *)0x0) {
                pcVar1 = *(code **)(arcfname + 0x48);
                *(undefined8 *)((long)ppuVar7 + -8) = 0x10af6f;
                (*pcVar1)(pcVar5);
                *(undefined8 *)((long)ppuVar7 + -8) = 0x10af79;
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
              }
              else {
                *(undefined8 *)((long)ppuVar7 + -8) = 0x10af8b;
                memset(__s,0,0x40);
                h->opaque = arcfname;
                h->mountPoint = (char *)len;
                h[1].opaque = openWriteList;
                openWriteList = (FileHandle *)h;
              }
            }
          }
        }
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10afce;
        __PHYSFS_platformReleaseMutex(stateLock);
        pPVar6 = io;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10afd7;
        __PHYSFS_smallFree(pPVar6);
        _fname_local = (char *)h;
      }
    }
  }
  return (PHYSFS_File *)_fname_local;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, const int appending)
{
    FileHandle *fh = NULL;
    DirHandle *h;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    h = writeDir;
    BAIL_IF_MUTEX(!h, PHYSFS_ERR_NO_WRITE_DIR, stateLock, 0);

    len = strlen(_fname) + dirHandleRootLen(h) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);

    if (sanitizePlatformIndependentPathWithRoot(h, _fname, fname))
    {
        PHYSFS_Io *io = NULL;
        char *arcfname = fname;
        if (verifyPath(h, &arcfname, 0))
        {
            const PHYSFS_Archiver *f = h->funcs;
            if (appending)
                io = f->openAppend(h->opaque, arcfname);
            else
                io = f->openWrite(h->opaque, arcfname);

            if (io)
            {
                fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
                if (fh == NULL)
                {
                    io->destroy(io);
                    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                } /* if */
                else
                {
                    memset(fh, '\0', sizeof (FileHandle));
                    fh->io = io;
                    fh->dirHandle = h;
                    fh->next = openWriteList;
                    openWriteList = fh;
                } /* else */
            } /* if */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}